

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t target;
  size_t loc;
  FxJumpStatement **ppFVar4;
  bool bVar5;
  ExpEmit local_54;
  uint local_50;
  ExpEmit local_4c;
  undefined1 uStack_49;
  uint i;
  ExpEmit iter;
  ExpEmit code;
  ExpEmit cond;
  ExpEmit init;
  size_t jumpspot;
  size_t codestart;
  size_t loopend;
  size_t loopstart;
  VMFunctionBuilder *build_local;
  FxForLoop *this_local;
  
  if ((this->Condition != (FxExpression *)0x0) && (this->Condition->ValueType == (PType *)TypeBool))
  {
    uVar1 = (*this->Condition->_vptr_FxExpression[3])();
    bVar5 = true;
    if ((uVar1 & 1) == 0) goto LAB_008d5075;
  }
  bVar5 = this->Condition == (FxExpression *)0x0;
LAB_008d5075:
  if (bVar5) {
    if (this->Init != (FxExpression *)0x0) {
      iVar2 = (*this->Init->_vptr_FxExpression[7])(this->Init,build);
      iter._1_2_ = SUB42(iVar2,0);
      ExpEmit::Free((ExpEmit *)&iter.RegType,build);
    }
    sVar3 = VMFunctionBuilder::GetAddress(build);
    if (this->Condition != (FxExpression *)0x0) {
      uVar1 = (*this->Condition->_vptr_FxExpression[7])(this->Condition,build);
      i._2_2_ = (undefined2)uVar1;
      iter.RegNum = (BYTE)(uVar1 >> 0x10);
      VMFunctionBuilder::Emit(build,0x36,uVar1 & 0xff,0);
      ExpEmit::Free((ExpEmit *)((long)&i + 2),build);
      register0x00000000 = VMFunctionBuilder::Emit(build,0x37,0);
    }
    if (this->Code != (FxExpression *)0x0) {
      iVar2 = (*this->Code->_vptr_FxExpression[7])(this->Code,build);
      _uStack_49 = (undefined2)iVar2;
      i._1_1_ = (undefined1)((uint)iVar2 >> 0x10);
      ExpEmit::Free((ExpEmit *)&uStack_49,build);
    }
    target = VMFunctionBuilder::GetAddress(build);
    if (this->Iteration != (FxExpression *)0x0) {
      iVar2 = (*this->Iteration->_vptr_FxExpression[7])(this->Iteration,build);
      local_4c._0_2_ = SUB42(iVar2,0);
      local_4c._2_1_ = SUB41((uint)iVar2 >> 0x10,0);
      ExpEmit::Free(&local_4c,build);
    }
    loc = VMFunctionBuilder::Emit(build,0x37,0);
    VMFunctionBuilder::Backpatch(build,loc,sVar3);
    sVar3 = VMFunctionBuilder::GetAddress(build);
    if (this->Condition != (FxExpression *)0x0) {
      VMFunctionBuilder::Backpatch(build,stack0xffffffffffffffc0,sVar3);
    }
    for (local_50 = 0;
        uVar1 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::Size
                          (&(this->super_FxExpression).JumpAddresses), local_50 < uVar1;
        local_50 = local_50 + 1) {
      ppFVar4 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                          (&(this->super_FxExpression).JumpAddresses,(ulong)local_50);
      if (*(int *)&((*ppFVar4)->super_FxExpression).field_0x34 == 0x125) {
        ppFVar4 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                            (&(this->super_FxExpression).JumpAddresses,(ulong)local_50);
        VMFunctionBuilder::Backpatch(build,(*ppFVar4)->Address,sVar3);
      }
      else {
        ppFVar4 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                            (&(this->super_FxExpression).JumpAddresses,(ulong)local_50);
        VMFunctionBuilder::Backpatch(build,(*ppFVar4)->Address,target);
      }
    }
    ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5));
    local_54._2_1_ = this_local._7_1_;
    local_54.RegNum = this_local._5_1_;
    local_54.RegType = this_local._6_1_;
    return local_54;
  }
  __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x1213,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	size_t jumpspot;

	// Init statement.
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		ExpEmit cond = Condition->Emit(build);
		build->Emit(OP_TEST, cond.RegNum, 0);
		cond.Free(build);
		jumpspot = build->Emit(OP_JMP, 0);
	}

	// Execute the loop's content.
	if (Code != nullptr)
	{
		ExpEmit code = Code->Emit(build);
		code.Free(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	if (Condition != nullptr)
	{
		build->Backpatch(jumpspot, loopend);
	}

	// Give a proper address to any break/continue statement within this loop.
	for (unsigned int i = 0; i < JumpAddresses.Size(); i++)
	{
		if (JumpAddresses[i]->Token == TK_Break)
		{
			build->Backpatch(JumpAddresses[i]->Address, loopend);
		}
		else
		{ // Continue statement.
			build->Backpatch(JumpAddresses[i]->Address, loopstart);
		}
	}

	return ExpEmit();
}